

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layer_switch_Dyy_unconditional(response_layer *layer,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float *pfVar16;
  float *pfVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  float *data;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  float *pfVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  float *data_1;
  long lVar40;
  float *pfVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  bool *pbVar45;
  int iVar46;
  float *pfVar47;
  undefined1 auVar48 [16];
  float fVar49;
  integral_image *local_1a8 [9];
  float *local_160;
  bool *local_158;
  int local_148;
  uint local_144;
  ulong local_120;
  long local_118;
  long local_110;
  float *local_50;
  float *local_40;
  
  iVar8 = iimage->height;
  iVar2 = layer->filter_size;
  if (iVar2 <= iVar8) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer,iimage);
    return;
  }
  uVar33 = iimage->width;
  uVar37 = (iVar2 + -1) - (iVar2 + -1 >> 0x1f) >> 1;
  uVar11 = iVar2 / 3;
  local_120 = (ulong)uVar11;
  if (iVar8 <= (int)uVar37) {
    iVar43 = layer->height;
    iVar7 = iimage->data_width;
    lVar21 = (long)iVar7;
    pfVar28 = iimage->data;
    iVar25 = layer->step;
    lVar40 = (long)iVar25;
    fVar49 = 1.0 / (float)(iVar2 * iVar2);
    local_160 = layer->response;
    local_158 = layer->laplacian;
    if ((int)uVar11 < (int)uVar33) {
      lVar21 = (long)local_1a8 - ((ulong)uVar33 * 4 + 0xf & 0xfffffffffffffff0);
      iVar36 = layer->width * iVar25;
      if (iVar36 - uVar11 == 0 || iVar36 < (int)uVar11) {
        lVar22 = 0;
      }
      else {
        lVar22 = 0;
        do {
          *(float *)(lVar21 + lVar22 * 4) =
               pfVar28[(int)((uVar11 - 1) + (iVar8 + -1) * iVar7 + (int)lVar22)];
          lVar22 = lVar22 + lVar40;
        } while (lVar22 < (long)(ulong)(iVar36 - uVar11));
      }
      iVar7 = (iVar8 + -1) * iVar7;
      fVar1 = pfVar28[(int)((uVar33 - 1) + iVar7)];
      local_1a8[0] = iimage;
      local_118 = lVar21;
      local_110 = lVar40;
      if ((int)lVar22 < (int)uVar11) {
        lVar22 = (long)(int)lVar22;
        do {
          *(float *)(lVar21 + lVar22 * 4) = fVar1;
          lVar22 = lVar22 + lVar40;
        } while (lVar22 < (int)uVar11);
      }
      iVar8 = (int)lVar22;
      if (iVar8 < iVar36) {
        lVar22 = (long)iVar8;
        iVar8 = (iVar7 + iVar8) - uVar11;
        do {
          *(float *)(lVar21 + lVar22 * 4) = fVar1 - pfVar28[iVar8];
          lVar22 = lVar22 + lVar40;
          iVar8 = iVar8 + iVar25;
        } while (lVar22 < iVar36);
      }
      iVar43 = iVar43 * iVar25;
      if (0 < iVar43) {
        local_144 = (uint)local_120;
        uVar23 = (ulong)(int)(uint)local_120;
        uVar29 = ~(uint)local_120;
        iVar25 = (uint)local_120 - 1;
        iVar31 = iVar25 - iVar2 / 6;
        uVar11 = ~(iVar2 / 6);
        uVar24 = ~uVar23;
        uVar37 = ~uVar37;
        iVar39 = -(uint)local_120;
        iVar38 = 0;
        iVar46 = -1;
        iVar7 = 0;
        uVar33 = uVar11;
        local_148 = iVar31;
        iVar8 = iVar25;
        do {
          if (0 < iVar36) {
            pfVar17 = local_1a8[0]->data;
            iVar19 = local_1a8[0]->data_width;
            pfVar28 = local_160 + iVar7;
            pbVar45 = local_158 + iVar7;
            iVar12 = iVar19 * local_144;
            iVar13 = iVar19 * iVar38;
            iVar14 = iVar19 * iVar46;
            iVar15 = iVar19 * uVar29;
            iVar32 = iVar19 * iVar39;
            iVar42 = iVar19 * iVar8;
            lVar21 = 0;
            do {
              iVar26 = (int)lVar21;
              auVar6 = vfmadd213ss_fma(ZEXT416((uint)((pfVar17[iVar42 + iVar31 + iVar26] -
                                                      pfVar17[iVar32 + iVar31 + iVar26]) +
                                                     (pfVar17[(int)(uVar11 + iVar32 + iVar26)] -
                                                     pfVar17[(int)(uVar11 + iVar42 + iVar26)]))),
                                       SUB6416(ZEXT464(0xc0400000),0),
                                       ZEXT416((uint)((pfVar17[(int)(uVar37 + iVar32 + iVar26)] -
                                                      pfVar17[(int)(uVar37 + iVar42 + iVar26)]) +
                                                     (pfVar17[(int)(uVar37 + iVar2 + iVar42 + iVar26
                                                                   )] -
                                                     pfVar17[(int)(uVar37 + iVar2 + iVar32 + iVar26)
                                                            ]))));
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)((pfVar17[((int)(iVar19 * uVar33) + lVar21) -
                                                                uVar23] -
                                                       pfVar17[(iVar19 * local_148 + lVar21) -
                                                               uVar23]) +
                                                      (pfVar17[iVar19 * local_148 + iVar25 + iVar26]
                                                      - pfVar17[(int)(iVar19 * uVar33 + iVar25 +
                                                                     iVar26)]))),
                                        SUB6416(ZEXT464(0xc0400000),0),
                                        ZEXT416(*(uint *)(local_118 + lVar21 * 4)));
              fVar1 = fVar49 * auVar48._0_4_;
              fVar4 = fVar49 * auVar6._0_4_;
              fVar5 = fVar49 * ((((pfVar17[(int)((uint)local_120 + iVar14 + iVar26)] -
                                  pfVar17[(int)((uint)local_120 + iVar15 + iVar26)]) +
                                  (pfVar17[iVar15 + lVar21] - pfVar17[iVar14 + lVar21]) +
                                 (pfVar17[iVar12 + -1 + iVar26] - pfVar17[iVar13 + -1 + iVar26]) +
                                 (pfVar17[uVar24 + iVar13 + lVar21] -
                                 pfVar17[uVar24 + iVar12 + lVar21])) -
                                ((pfVar17[iVar14 + -1 + iVar26] - pfVar17[iVar15 + -1 + iVar26]) +
                                (pfVar17[uVar24 + iVar15 + lVar21] -
                                pfVar17[uVar24 + iVar14 + lVar21]))) -
                               ((pfVar17[(int)((uint)local_120 + iVar12 + iVar26)] -
                                pfVar17[(int)((uint)local_120 + iVar13 + iVar26)]) +
                               (pfVar17[iVar13 + lVar21] - pfVar17[iVar12 + lVar21])));
              auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5 * -0.81)),ZEXT416((uint)fVar4),
                                       ZEXT416((uint)fVar1));
              *pfVar28 = auVar6._0_4_;
              *pbVar45 = 0.0 <= fVar1 + fVar4;
              lVar21 = lVar21 + local_110;
              pfVar28 = pfVar28 + 1;
              pbVar45 = pbVar45 + 1;
              iVar7 = iVar7 + 1;
              lVar40 = local_110;
            } while (lVar21 < iVar36);
          }
          iVar19 = (int)lVar40;
          iVar38 = iVar38 + iVar19;
          local_144 = local_144 + iVar19;
          iVar46 = iVar46 + iVar19;
          uVar29 = uVar29 + iVar19;
          local_148 = local_148 + iVar19;
          uVar33 = uVar33 + iVar19;
          iVar39 = iVar39 + iVar19;
          iVar8 = iVar8 + iVar19;
        } while (iVar38 < iVar43);
      }
    }
    else {
      fVar1 = pfVar28[(int)((iVar8 + -1) * iVar7 + -1 + uVar33)];
      iVar8 = layer->width * iVar25;
      uVar29 = iVar2 / 6;
      uVar10 = ~uVar29;
      uVar18 = ~uVar37;
      uVar30 = ~uVar11;
      lVar22 = (long)iVar8;
      uVar23 = (ulong)(int)uVar11;
      if (iVar8 - uVar29 == 0 || iVar8 < (int)uVar29) {
        iVar36 = 0;
        lVar35 = 0;
      }
      else {
        iVar13 = iVar7 * uVar11;
        iVar14 = iVar25 * iVar7;
        iVar32 = -iVar7;
        iVar15 = (iVar7 + 1) * uVar11;
        iVar31 = uVar11 - iVar7;
        iVar42 = iVar7 * (uVar11 - 1);
        iVar39 = (iVar42 + -1) - uVar37;
        iVar38 = (iVar42 + -1) - uVar29;
        iVar46 = uVar18 + iVar2 + iVar42;
        iVar42 = iVar42 + uVar10 + uVar11;
        iVar19 = (iVar7 + -1) * uVar11 + -1;
        uVar20 = ~(iVar7 + uVar11);
        iVar12 = iVar13 + -1;
        lVar35 = 0;
        iVar36 = 0;
        local_40 = pfVar28;
        do {
          auVar6 = vfmadd213ss_fma(ZEXT416((uint)pfVar28[(int)((uVar10 + uVar11 + (int)lVar35) *
                                                               iVar7 + (uVar33 - 1))]),
                                   SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar1));
          if (0 < iVar8) {
            pfVar17 = pfVar28 + iVar13;
            pfVar16 = pfVar28 + iVar32;
            fVar4 = fVar49 * auVar6._0_4_;
            lVar9 = (lVar35 - uVar23) * lVar21;
            lVar27 = ((lVar35 + -1) - uVar23) * lVar21;
            lVar34 = lVar35 * lVar21;
            pfVar47 = local_160 + iVar36;
            pbVar45 = local_158 + iVar36;
            lVar44 = 0;
            pfVar41 = local_40;
            do {
              iVar26 = (int)lVar44;
              auVar6 = vfmadd132ss_fma(ZEXT416((uint)((pfVar28[lVar9 + (int)(uVar10 + iVar26)] -
                                                      pfVar28[iVar38 + iVar26]) +
                                                     (pfVar28[iVar42 + iVar26] -
                                                     pfVar28[lVar9 + (int)(((uVar11 - 1) - uVar29) +
                                                                          iVar26)]))),
                                       ZEXT416((uint)((pfVar28[lVar9 + (int)(uVar18 + iVar26)] -
                                                      pfVar28[iVar39 + iVar26]) +
                                                     (pfVar28[iVar46 + iVar26] -
                                                     pfVar28[lVar9 + (int)(uVar18 + iVar2 + iVar26)]
                                                     ))),SUB6416(ZEXT464(0xc0400000),0));
              fVar5 = fVar49 * auVar6._0_4_;
              fVar3 = fVar49 * ((((pfVar28[lVar34 + (int)(uVar30 + iVar26)] -
                                  pfVar28[iVar19 + iVar26]) +
                                  (pfVar28[iVar12 + iVar26] - pfVar28[lVar34 + (iVar26 + -1)]) +
                                 (pfVar28[iVar31 + iVar26] -
                                 pfVar28[lVar27 + (int)(uVar11 + iVar26)]) +
                                 (pfVar41[~uVar23 * lVar21] - *pfVar16)) -
                                ((pfVar28[lVar27 + (int)(uVar30 + iVar26)] -
                                 pfVar28[(int)(uVar20 + iVar26)]) +
                                (pfVar28[iVar26 + -1 + iVar32] - pfVar28[lVar27 + (iVar26 + -1)])))
                               - ((*pfVar41 - *pfVar17) +
                                 (pfVar28[iVar15 + iVar26] -
                                 pfVar28[lVar34 + (int)(uVar11 + iVar26)])));
              auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * -0.81 * fVar3)),ZEXT416((uint)fVar5),
                                       ZEXT416((uint)fVar4));
              *pfVar47 = auVar6._0_4_;
              *pbVar45 = 0.0 <= fVar4 + fVar5;
              lVar44 = lVar44 + lVar40;
              pfVar47 = pfVar47 + 1;
              pbVar45 = pbVar45 + 1;
              iVar36 = iVar36 + 1;
              pfVar17 = pfVar17 + lVar40;
              pfVar41 = pfVar41 + lVar40;
              pfVar16 = pfVar16 + lVar40;
            } while (lVar44 < lVar22);
          }
          lVar35 = lVar35 + lVar40;
          iVar13 = iVar13 + iVar14;
          local_40 = local_40 + lVar40 * lVar21;
          iVar32 = iVar32 + iVar14;
          iVar15 = iVar15 + iVar14;
          iVar31 = iVar31 + iVar14;
          iVar39 = iVar39 + iVar14;
          iVar46 = iVar46 + iVar14;
          iVar38 = iVar38 + iVar14;
          iVar42 = iVar42 + iVar14;
          iVar19 = iVar19 + iVar14;
          uVar20 = uVar20 + iVar14;
          iVar12 = iVar12 + iVar14;
        } while (lVar35 < (long)(ulong)(iVar8 - uVar29));
      }
      fVar1 = fVar1 * -2.0;
      iVar31 = (int)lVar35;
      if (iVar31 <= (int)uVar29) {
        fVar4 = fVar49 * fVar1;
        lVar35 = (long)iVar31;
        iVar39 = (iVar31 + uVar11) * iVar7;
        iVar13 = iVar25 * iVar7;
        pfVar17 = pfVar28 + lVar35 * lVar21;
        local_50 = pfVar28 + (~uVar23 + lVar35) * lVar21;
        iVar15 = (iVar31 + -1) * iVar7;
        iVar31 = (iVar31 + -1 + uVar11) * iVar7;
        iVar38 = (iVar31 + -1) - uVar37;
        iVar32 = uVar18 + iVar2 + iVar31;
        iVar42 = (iVar31 + -1) - uVar29;
        iVar31 = iVar31 + uVar11 + uVar10;
        iVar14 = uVar11 + iVar39;
        iVar46 = uVar11 + iVar15;
        iVar19 = uVar30 + iVar39;
        iVar12 = uVar30 + iVar15;
        do {
          if (0 < iVar8) {
            lVar9 = (lVar35 - uVar23) * lVar21;
            lVar27 = ((lVar35 + -1) - uVar23) * lVar21;
            lVar34 = lVar35 * lVar21;
            pfVar16 = local_160 + iVar36;
            pbVar45 = local_158 + iVar36;
            lVar44 = 0;
            do {
              iVar26 = (int)lVar44;
              auVar6 = vfmadd132ss_fma(ZEXT416((uint)((pfVar28[lVar9 + (int)(uVar10 + iVar26)] -
                                                      pfVar28[iVar42 + iVar26]) +
                                                     (pfVar28[iVar31 + iVar26] -
                                                     pfVar28[lVar9 + (int)(uVar10 + uVar11 + iVar26)
                                                            ]))),
                                       ZEXT416((uint)((pfVar28[lVar9 + (int)(uVar18 + iVar26)] -
                                                      pfVar28[iVar38 + iVar26]) +
                                                     (pfVar28[iVar32 + iVar26] -
                                                     pfVar28[lVar9 + (int)(uVar18 + iVar2 + iVar26)]
                                                     ))),SUB6416(ZEXT464(0xc0400000),0));
              fVar5 = fVar49 * auVar6._0_4_;
              fVar3 = fVar49 * ((((pfVar28[lVar34 + (int)(uVar30 + iVar26)] -
                                  pfVar28[iVar19 + iVar26]) +
                                  (pfVar28[iVar26 + -1 + iVar39] - pfVar28[lVar34 + (iVar26 + -1)])
                                 + (pfVar28[iVar46 + iVar26] -
                                   pfVar28[lVar27 + (int)(uVar11 + iVar26)]) +
                                   (local_50[lVar44] - pfVar28[iVar15 + lVar44])) -
                                ((pfVar28[lVar27 + (int)(uVar30 + iVar26)] -
                                 pfVar28[iVar12 + iVar26]) +
                                (pfVar28[iVar26 + -1 + iVar15] - pfVar28[lVar27 + (iVar26 + -1)])))
                               - ((pfVar17[lVar44] - pfVar28[iVar39 + lVar44]) +
                                 (pfVar28[iVar14 + iVar26] -
                                 pfVar28[lVar34 + (int)(uVar11 + iVar26)])));
              auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * -0.81 * fVar3)),ZEXT416((uint)fVar5),
                                       ZEXT416((uint)fVar4));
              *pfVar16 = auVar6._0_4_;
              *pbVar45 = 0.0 <= fVar4 + fVar5;
              lVar44 = lVar44 + lVar40;
              pfVar16 = pfVar16 + 1;
              pbVar45 = pbVar45 + 1;
              iVar36 = iVar36 + 1;
            } while (lVar44 < lVar22);
          }
          lVar35 = lVar35 + lVar40;
          iVar39 = iVar39 + iVar13;
          pfVar17 = pfVar17 + lVar40 * lVar21;
          iVar15 = iVar15 + iVar13;
          local_50 = local_50 + lVar40 * lVar21;
          iVar14 = iVar14 + iVar13;
          iVar46 = iVar46 + iVar13;
          iVar38 = iVar38 + iVar13;
          iVar32 = iVar32 + iVar13;
          iVar42 = iVar42 + iVar13;
          iVar31 = iVar31 + iVar13;
          iVar19 = iVar19 + iVar13;
          iVar12 = iVar12 + iVar13;
        } while (lVar35 <= (int)uVar29);
        iVar31 = (int)lVar35;
      }
      iVar43 = iVar43 * iVar25;
      if (iVar31 < iVar43) {
        lVar35 = (long)iVar31;
        iVar32 = (iVar31 + uVar11) * iVar7;
        iVar25 = iVar25 * iVar7;
        pfVar17 = pfVar28 + lVar35 * lVar21;
        iVar46 = (iVar31 + -1) * iVar7;
        iVar31 = (iVar31 + -1 + uVar11) * iVar7;
        iVar12 = (iVar31 + -1) - uVar37;
        local_50 = pfVar28 + (~uVar23 + lVar35) * lVar21;
        iVar13 = (iVar31 + -1) - uVar29;
        iVar15 = iVar2 + uVar18 + iVar31;
        iVar39 = iVar31 + uVar11 + uVar10;
        iVar31 = uVar11 + iVar32;
        iVar14 = uVar11 + iVar46;
        iVar38 = uVar30 + iVar32;
        iVar19 = uVar30 + iVar46;
        do {
          auVar6 = vfmadd213ss_fma(ZEXT416((uint)pfVar28[(int)(((int)lVar35 + uVar10) * iVar7 +
                                                              (uVar33 - 1))]),
                                   SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar1));
          if (0 < iVar8) {
            fVar4 = fVar49 * auVar6._0_4_;
            lVar9 = (lVar35 - uVar23) * lVar21;
            lVar34 = ((lVar35 + -1) - uVar23) * lVar21;
            lVar44 = lVar35 * lVar21;
            pfVar16 = local_160 + iVar36;
            pbVar45 = local_158 + iVar36;
            lVar27 = 0;
            do {
              iVar42 = (int)lVar27;
              auVar48 = vsubss_avx512f(ZEXT416((uint)pfVar28[iVar31 + iVar42]),
                                       ZEXT416((uint)pfVar28[lVar44 + (int)(uVar11 + iVar42)]));
              auVar6 = vfmadd132ss_fma(ZEXT416((uint)((pfVar28[lVar9 + (int)(uVar10 + iVar42)] -
                                                      pfVar28[iVar13 + iVar42]) +
                                                     (pfVar28[iVar39 + iVar42] -
                                                     pfVar28[lVar9 + (int)(uVar10 + uVar11 + iVar42)
                                                            ]))),
                                       ZEXT416((uint)((pfVar28[iVar15 + iVar42] -
                                                      pfVar28[lVar9 + (int)(iVar2 + uVar18 + iVar42)
                                                             ]) +
                                                     (pfVar28[lVar9 + (int)(uVar18 + iVar42)] -
                                                     pfVar28[iVar12 + iVar42]))),
                                       SUB6416(ZEXT464(0xc0400000),0));
              auVar48 = vaddss_avx512f(ZEXT416((uint)(pfVar17[lVar27] - pfVar28[iVar32 + lVar27])),
                                       auVar48);
              fVar5 = auVar6._0_4_ * fVar49;
              fVar3 = fVar49 * ((((pfVar28[lVar44 + (int)(uVar30 + iVar42)] -
                                  pfVar28[iVar38 + iVar42]) +
                                  (pfVar28[iVar42 + -1 + iVar32] - pfVar28[lVar44 + (iVar42 + -1)])
                                 + (pfVar28[iVar14 + iVar42] -
                                   pfVar28[lVar34 + (int)(uVar11 + iVar42)]) +
                                   (local_50[lVar27] - pfVar28[iVar46 + lVar27])) -
                                ((pfVar28[lVar34 + (int)(uVar30 + iVar42)] -
                                 pfVar28[iVar19 + iVar42]) +
                                (pfVar28[iVar42 + -1 + iVar46] - pfVar28[lVar34 + (iVar42 + -1)])))
                               - auVar48._0_4_);
              auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * -0.81 * fVar3)),ZEXT416((uint)fVar5),
                                       ZEXT416((uint)fVar4));
              *pfVar16 = auVar6._0_4_;
              *pbVar45 = 0.0 <= fVar5 + fVar4;
              lVar27 = lVar27 + lVar40;
              pfVar16 = pfVar16 + 1;
              pbVar45 = pbVar45 + 1;
              iVar36 = iVar36 + 1;
            } while (lVar27 < lVar22);
          }
          lVar35 = lVar35 + lVar40;
          iVar32 = iVar32 + iVar25;
          pfVar17 = pfVar17 + lVar40 * lVar21;
          iVar46 = iVar46 + iVar25;
          local_50 = local_50 + lVar40 * lVar21;
          iVar31 = iVar31 + iVar25;
          iVar14 = iVar14 + iVar25;
          iVar12 = iVar12 + iVar25;
          iVar15 = iVar15 + iVar25;
          iVar13 = iVar13 + iVar25;
          iVar39 = iVar39 + iVar25;
          iVar38 = iVar38 + iVar25;
          iVar19 = iVar19 + iVar25;
        } while (lVar35 < iVar43);
      }
    }
    return;
  }
  if (SBORROW4(uVar33,uVar11 * 2) == (int)(uVar33 + uVar11 * -2) < 0) {
    height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
    return;
  }
  height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function:
        - compute_response_layer_switch_Dyy
        (- compute_response_layer_unconditional)

        optimization:
        - box_integral_unconditional instead of box_integral
            => makes use of padded image and removes all conditionals
        - uses compute_response_layer_Dyy_laplacian_locality_uncond_opt_flops_inlined
            => best function for filter_size <= iheight
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        // 2. Case The filter is somewhat larger than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image. Blue lines edition brings the switch into Dyy
            // Idea: Do compute_response_layer_Dyy_leftcorner
            // but everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO: fix this

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    for (y = 0; y < width*step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {
                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height * step; x += step) {

                    for (y = 0; y < width * step; y += step) {
                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
                        Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}